

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

char * getstring_aux(lua_State *L,char *buff,char **pc)

{
  char cVar1;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  
  skip(pc);
  pcVar4 = *pc;
  cVar1 = *pcVar4;
  if ((cVar1 == '\"') || (cVar1 == '\'')) {
    pcVar2 = pcVar4 + 1;
    uVar5 = 0;
    *pc = pcVar2;
    cVar1 = *pcVar4;
    while( true ) {
      if (*pcVar2 == cVar1) break;
      if (*pcVar2 == '\0') {
        luaL_error(L,"unfinished string in C script");
        pcVar2 = *pc;
      }
      *pc = pcVar2 + 1;
      buff[uVar5] = *pcVar2;
      uVar5 = uVar5 + 1;
      pcVar2 = *pc;
    }
    *pc = pcVar2 + 1;
  }
  else {
    uVar5 = 0;
    while (cVar1 != '\0') {
      pvVar3 = memchr(" \t\n,;",(int)cVar1,6);
      if (pvVar3 != (void *)0x0) break;
      *pc = pcVar4 + 1;
      buff[uVar5] = *pcVar4;
      uVar5 = uVar5 + 1;
      pcVar4 = *pc;
      cVar1 = *pcVar4;
    }
  }
  buff[uVar5 & 0xffffffff] = '\0';
  return buff;
}

Assistant:

static const char *getstring_aux (lua_State *L, char *buff, const char **pc) {
  int i = 0;
  skip(pc);
  if (**pc == '"' || **pc == '\'') {  /* quoted string? */
    int quote = *(*pc)++;
    while (**pc != quote) {
      if (**pc == '\0') luaL_error(L, "unfinished string in C script");
      buff[i++] = *(*pc)++;
    }
    (*pc)++;
  }
  else {
    while (**pc != '\0' && !strchr(delimits, **pc))
      buff[i++] = *(*pc)++;
  }
  buff[i] = '\0';
  return buff;
}